

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double Cudd_CountPath(DdNode *node)

{
  st__table *table_00;
  double i;
  st__table *table;
  DdNode *node_local;
  
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    node_local = (DdNode *)0xbff0000000000000;
  }
  else {
    node_local = (DdNode *)ddCountPathAux((DdNode *)((ulong)node & 0xfffffffffffffffe),table_00);
    st__foreach(table_00,cuddStCountfree,(char *)0x0);
    st__free_table(table_00);
  }
  return (double)node_local;
}

Assistant:

double
Cudd_CountPath(
  DdNode * node)
{

    st__table    *table;
    double      i;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    i = ddCountPathAux(Cudd_Regular(node),table);
    st__foreach(table, cuddStCountfree, NULL);
    st__free_table(table);
    return(i);

}